

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O3

void __thiscall
tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
::~intrusive_shared_ptr_t
          (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
           *this)

{
  make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *pmVar1;
  underflow_error *this_00;
  
  pmVar1 = this->_t;
  if (pmVar1 != (make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *)0x0) {
    if (*(long *)(pmVar1 + -2) == 0) {
      this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
      std::underflow_error::underflow_error(this_00,"reference counter underflow");
      __cxa_throw(this_00,&std::underflow_error::typeinfo,std::underflow_error::~underflow_error);
    }
    *(long *)(pmVar1 + -2) = *(long *)(pmVar1 + -2) + -1;
  }
  this->_t = (make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *)0x0;
  return;
}

Assistant:

inline void reset(T * t = nullptr)
  {
    if (t != nullptr)
      t->take_reference();
    if (_t != nullptr)
      _t->release_reference();
    _t = t;
  }